

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.h
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::SurrogatePairTracker::
SurrogatePairTracker
          (SurrogatePairTracker *this,EncodedChar *location,codepoint_t value,uint32 length,
          size_t multiUnits)

{
  this->location = location;
  this->rangeLocation = (EncodedChar *)0x0;
  this->value = value;
  this->length = length;
  this->multiUnits = multiUnits;
  this->next = (SurrogatePairTracker *)0x0;
  return;
}

Assistant:

SurrogatePairTracker(const EncodedChar* location, codepoint_t value, uint32 length, size_t multiUnits)
                : location(location)
                , next(nullptr)
                , value(value)
                , length(length)
                , multiUnits(multiUnits)
                , rangeLocation(nullptr)
            {
            }